

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
::emplacePriority<helics::route_id&,helics::ActionMessage_const&>
          (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
           *this,route_id *args,ActionMessage *args_1)

{
  bool bVar1;
  mutex_type *in_RDI;
  bool *unaff_retaddr;
  unique_lock<std::mutex> pullLock_1;
  unique_lock<std::mutex> pullLock;
  bool expEmpty;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  mutex_type *pmVar2;
  
  pmVar2 = in_RDI;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)pullLock_1._M_device,unaff_retaddr,
                     SUB81((ulong)in_RDI >> 0x38,0),(memory_order)in_RDI);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_RDI);
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_ffffffffffffffb0,SUB81((ulong)in_RDI >> 0x38,0));
    std::
    queue<std::pair<helics::route_id,helics::ActionMessage>,std::deque<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>>
    ::emplace<helics::route_id&,helics::ActionMessage_const&>
              ((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                *)in_stack_ffffffffffffffb0,(route_id *)in_RDI,(ActionMessage *)0x43af0a);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffb0);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_RDI);
    std::
    queue<std::pair<helics::route_id,helics::ActionMessage>,std::deque<std::pair<helics::route_id,helics::ActionMessage>,std::allocator<std::pair<helics::route_id,helics::ActionMessage>>>>
    ::emplace<helics::route_id&,helics::ActionMessage_const&>
              ((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                *)in_stack_ffffffffffffffb0,(route_id *)in_RDI,(ActionMessage *)0x43af74);
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)pullLock_1._M_device,unaff_retaddr,
                       SUB81((ulong)pmVar2 >> 0x38,0),(memory_order)pmVar2);
    if (bVar1) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void emplacePriority(Args&&... args)
        {
            bool expEmpty = true;
            if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                queueEmptyFlag = false;  // need to set the flag again just in
                                         // case after we get the lock
                priorityQueue.emplace(std::forward<Args>(args)...);
                // pullLock.unlock ();
                condition.notify_all();
            } else {
                std::unique_lock<MUTEX> pullLock(m_pullLock);
                priorityQueue.emplace(std::forward<Args>(args)...);
                expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    condition.notify_all();
                }
            }
        }